

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O1

void __thiscall Assimp::MDLImporter::ValidateHeader_Quake1(MDLImporter *this,Header *pcHeader)

{
  Logger *pLVar1;
  runtime_error *prVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (pcHeader->num_frames == 0) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_40,"[Quake 1 MDL] There are no frames in the file","");
    std::runtime_error::runtime_error(prVar2,(string *)local_40);
    *(undefined ***)prVar2 = &PTR__runtime_error_0081d260;
    __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pcHeader->num_verts != 0) {
    if (pcHeader->num_tris == 0) {
      prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_40[0] = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_40,"[Quake 1 MDL] There are no triangles in the file","");
      std::runtime_error::runtime_error(prVar2,(string *)local_40);
      *(undefined ***)prVar2 = &PTR__runtime_error_0081d260;
      __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->iGSFileVersion == 0) {
      if (0x400 < pcHeader->num_verts) {
        pLVar1 = DefaultLogger::get();
        Logger::warn(pLVar1,"Quake 1 MDL model has more than AI_MDL_MAX_VERTS vertices");
      }
      if (0x800 < pcHeader->num_tris) {
        pLVar1 = DefaultLogger::get();
        Logger::warn(pLVar1,"Quake 1 MDL model has more than AI_MDL_MAX_TRIANGLES triangles");
      }
      if (0x100 < pcHeader->num_frames) {
        pLVar1 = DefaultLogger::get();
        Logger::warn(pLVar1,"Quake 1 MDL model has more than AI_MDL_MAX_FRAMES frames");
      }
      if ((this->iGSFileVersion == 0) && (pcHeader->version != 6)) {
        pLVar1 = DefaultLogger::get();
        Logger::warn(pLVar1,
                     "Quake 1 MDL model has an unknown version: AI_MDL_VERSION (=6) is the expected file format version"
                    );
      }
      if ((pcHeader->num_skins != 0) && ((pcHeader->skinwidth == 0 || (pcHeader->skinheight == 0))))
      {
        pLVar1 = DefaultLogger::get();
        Logger::warn(pLVar1,"Skin width or height are 0");
        return;
      }
    }
    return;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"[Quake 1 MDL] There are no vertices in the file","");
  std::runtime_error::runtime_error(prVar2,(string *)local_40);
  *(undefined ***)prVar2 = &PTR__runtime_error_0081d260;
  __cxa_throw(prVar2,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDLImporter::ValidateHeader_Quake1(const MDL::Header* pcHeader)
{
    // some values may not be NULL
    if (!pcHeader->num_frames)
        throw DeadlyImportError( "[Quake 1 MDL] There are no frames in the file");

    if (!pcHeader->num_verts)
        throw DeadlyImportError( "[Quake 1 MDL] There are no vertices in the file");

    if (!pcHeader->num_tris)
        throw DeadlyImportError( "[Quake 1 MDL] There are no triangles in the file");

    // check whether the maxima are exceeded ...however, this applies for Quake 1 MDLs only
    if (!this->iGSFileVersion)
    {
        if (pcHeader->num_verts > AI_MDL_MAX_VERTS)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_VERTS vertices");

        if (pcHeader->num_tris > AI_MDL_MAX_TRIANGLES)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_TRIANGLES triangles");

        if (pcHeader->num_frames > AI_MDL_MAX_FRAMES)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_FRAMES frames");

        // (this does not apply for 3DGS MDLs)
        if (!this->iGSFileVersion && pcHeader->version != AI_MDL_VERSION)
            ASSIMP_LOG_WARN("Quake 1 MDL model has an unknown version: AI_MDL_VERSION (=6) is "
                "the expected file format version");
        if(pcHeader->num_skins && (!pcHeader->skinwidth || !pcHeader->skinheight))
            ASSIMP_LOG_WARN("Skin width or height are 0");
    }
}